

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void base_unmap(tsdn_t *tsdn,ehooks_t *ehooks,uint ind,void *addr,size_t size)

{
  extent_hooks_t *peVar1;
  _Bool _Var2;
  bool bVar3;
  char cVar4;
  undefined4 in_register_00000014;
  void *addr_00;
  
  addr_00 = (void *)CONCAT44(in_register_00000014,ind);
  if ((extent_hooks_t *)(ehooks->ptr).repr == &duckdb_je_ehooks_default_extent_hooks) {
    _Var2 = duckdb_je_extent_dalloc_mmap(addr_00,(size_t)addr);
    if (((_Var2) && (_Var2 = duckdb_je_pages_decommit(addr_00,(size_t)addr), _Var2)) &&
       (_Var2 = duckdb_je_pages_purge_forced(addr_00,(size_t)addr), _Var2)) {
      duckdb_je_pages_purge_lazy(addr_00,(size_t)addr);
    }
    goto LAB_01f850f7;
  }
  peVar1 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar1 == &duckdb_je_ehooks_default_extent_hooks) {
    bVar3 = duckdb_je_ehooks_default_dalloc_impl(addr_00,(size_t)addr);
joined_r0x01f84ff6:
    if (!bVar3) goto LAB_01f850f7;
  }
  else if (peVar1->dalloc != (extent_dalloc_t *)0x0) {
    ehooks_pre_reentrancy(tsdn);
    bVar3 = (*peVar1->dalloc)(peVar1,addr_00,(size_t)addr,true,ehooks->ind);
    ehooks_post_reentrancy(tsdn);
    goto joined_r0x01f84ff6;
  }
  peVar1 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar1 == &duckdb_je_ehooks_default_extent_hooks) {
    _Var2 = duckdb_je_ehooks_default_decommit_impl(addr_00,0,(size_t)addr);
    if (!_Var2) goto LAB_01f850f7;
  }
  else if (peVar1->decommit != (undefined1 *)0x0) {
    ehooks_pre_reentrancy(tsdn);
    cVar4 = (*(code *)peVar1->decommit)(peVar1,addr_00,addr,0,addr,ehooks->ind);
    ehooks_post_reentrancy(tsdn);
    if (cVar4 == '\0') goto LAB_01f850f7;
  }
  peVar1 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar1 == &duckdb_je_ehooks_default_extent_hooks) {
    _Var2 = duckdb_je_ehooks_default_purge_forced_impl(addr_00,0,(size_t)addr);
    if (!_Var2) goto LAB_01f850f7;
  }
  else if (peVar1->purge_forced != (undefined1 *)0x0) {
    ehooks_pre_reentrancy(tsdn);
    cVar4 = (*(code *)peVar1->purge_forced)(peVar1,addr_00,addr,0,addr,ehooks->ind);
    ehooks_post_reentrancy(tsdn);
    if (cVar4 == '\0') goto LAB_01f850f7;
  }
  peVar1 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar1 == &duckdb_je_ehooks_default_extent_hooks) {
    duckdb_je_ehooks_default_purge_lazy_impl(addr_00,0,(size_t)addr);
  }
  else if (peVar1->purge_lazy != (undefined1 *)0x0) {
    ehooks_pre_reentrancy(tsdn);
    (*(code *)peVar1->purge_lazy)(peVar1,addr_00,addr,0,addr,ehooks->ind);
    ehooks_post_reentrancy(tsdn);
  }
LAB_01f850f7:
  if ((duckdb_je_opt_metadata_thp != metadata_thp_disabled) &&
     (duckdb_je_init_system_thp_mode == thp_mode_default)) {
    duckdb_je_pages_nohuge(addr_00,(size_t)addr);
    return;
  }
  return;
}

Assistant:

static void
base_unmap(tsdn_t *tsdn, ehooks_t *ehooks, unsigned ind, void *addr,
    size_t size) {
	/*
	 * Cascade through dalloc, decommit, purge_forced, and purge_lazy,
	 * stopping at first success.  This cascade is performed for consistency
	 * with the cascade in extent_dalloc_wrapper() because an application's
	 * custom hooks may not support e.g. dalloc.  This function is only ever
	 * called as a side effect of arena destruction, so although it might
	 * seem pointless to do anything besides dalloc here, the application
	 * may in fact want the end state of all associated virtual memory to be
	 * in some consistent-but-allocated state.
	 */
	if (ehooks_are_default(ehooks)) {
		if (!extent_dalloc_mmap(addr, size)) {
			goto label_done;
		}
		if (!pages_decommit(addr, size)) {
			goto label_done;
		}
		if (!pages_purge_forced(addr, size)) {
			goto label_done;
		}
		if (!pages_purge_lazy(addr, size)) {
			goto label_done;
		}
		/* Nothing worked.  This should never happen. */
		not_reached();
	} else {
		if (!ehooks_dalloc(tsdn, ehooks, addr, size, true)) {
			goto label_done;
		}
		if (!ehooks_decommit(tsdn, ehooks, addr, size, 0, size)) {
			goto label_done;
		}
		if (!ehooks_purge_forced(tsdn, ehooks, addr, size, 0, size)) {
			goto label_done;
		}
		if (!ehooks_purge_lazy(tsdn, ehooks, addr, size, 0, size)) {
			goto label_done;
		}
		/* Nothing worked.  That's the application's problem. */
	}
label_done:
	if (metadata_thp_madvise()) {
		/* Set NOHUGEPAGE after unmap to avoid kernel defrag. */
		assert(((uintptr_t)addr & HUGEPAGE_MASK) == 0 &&
		    (size & HUGEPAGE_MASK) == 0);
		pages_nohuge(addr, size);
	}
}